

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O2

void embree::sse42::
     BVHNIntersector1<4,_1,_false,_embree::sse42::ArrayIntersector1<embree::sse42::TriangleMIntersector1Moeller<4,_true>_>_>
     ::occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte bVar6;
  undefined1 *puVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  float fVar14;
  uint uVar15;
  float fVar17;
  uint uVar18;
  float fVar19;
  uint uVar20;
  vint4 bi;
  undefined1 auVar16 [16];
  float fVar21;
  uint uVar22;
  float fVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  uint uVar27;
  uint uVar28;
  float fVar29;
  uint uVar30;
  uint uVar31;
  vint4 ai;
  float fVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  float fVar36;
  uint uVar38;
  float fVar39;
  uint uVar40;
  float fVar41;
  vint4 ai_1;
  undefined1 auVar37 [16];
  uint uVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  float fVar83;
  float fVar84;
  float fVar85;
  HitK<1> h;
  RTCFilterFunctionNArguments args;
  NodeRef stack [244];
  int local_9e4;
  RTCIntersectArguments *local_9e0;
  long local_9d8;
  RayQueryContext *local_9d0;
  float local_9c8;
  float fStack_9c4;
  float fStack_9c0;
  float fStack_9bc;
  long local_9b8;
  long local_9b0;
  long local_9a8;
  ulong local_9a0;
  ulong *local_998;
  ulong local_990;
  undefined4 local_988;
  float local_984;
  float local_980;
  undefined4 local_97c;
  float local_978;
  undefined4 local_974;
  uint local_970;
  uint local_96c;
  uint local_968;
  RTCFilterFunctionNArguments local_958;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  float local_8d8;
  float fStack_8d4;
  float fStack_8d0;
  float fStack_8cc;
  float local_8c8;
  float fStack_8c4;
  float fStack_8c0;
  float fStack_8bc;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  undefined1 local_8a8 [16];
  undefined1 local_898 [16];
  float local_888;
  float fStack_884;
  float fStack_880;
  float fStack_87c;
  float local_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  undefined1 local_848 [16];
  undefined1 local_838 [16];
  undefined1 local_828 [16];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  float local_7e8 [4];
  ulong local_7d8 [245];
  
  local_7d8[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if ((local_7d8[0] != 8) && (fVar36 = ray->tfar, 0.0 <= fVar36)) {
    local_9d0 = context;
    local_998 = local_7d8 + 1;
    fVar39 = (ray->org).field_0.m128[0];
    fVar41 = (ray->org).field_0.m128[1];
    fVar43 = (ray->org).field_0.m128[2];
    fVar49 = *(float *)((long)&(ray->org).field_0 + 0xc);
    aVar3 = (ray->dir).field_0.field_1;
    fVar60 = 0.0;
    if (0.0 <= fVar49) {
      fVar60 = fVar49;
    }
    auVar16._4_4_ = -(uint)(ABS(aVar3.y) < DAT_01f4bd50._4_4_);
    auVar16._0_4_ = -(uint)(ABS(aVar3.x) < (float)DAT_01f4bd50);
    auVar16._8_4_ = -(uint)(ABS(aVar3.z) < DAT_01f4bd50._8_4_);
    auVar16._12_4_ = -(uint)(ABS(aVar3.field_3.w) < DAT_01f4bd50._12_4_);
    auVar37 = blendvps((undefined1  [16])aVar3,_DAT_01f4bd50,auVar16);
    auVar16 = rcpps(auVar16,auVar37);
    fVar44 = auVar16._0_4_;
    fVar46 = auVar16._4_4_;
    fVar49 = auVar16._8_4_;
    fVar44 = (1.0 - auVar37._0_4_ * fVar44) * fVar44 + fVar44;
    fVar46 = (1.0 - auVar37._4_4_ * fVar46) * fVar46 + fVar46;
    fVar49 = (1.0 - auVar37._8_4_ * fVar49) * fVar49 + fVar49;
    local_9a0 = (ulong)(fVar44 < 0.0) << 4;
    uVar11 = (ulong)(fVar46 < 0.0) << 4 | 0x20;
    uVar10 = (ulong)(fVar49 < 0.0) << 4 | 0x40;
    uVar12 = local_9a0 ^ 0x10;
    puVar7 = mm_lookupmask_ps;
    local_8a8 = mm_lookupmask_ps._240_16_;
    local_8b8 = fVar36;
    fStack_8b4 = fVar36;
    fStack_8b0 = fVar36;
    fStack_8ac = fVar36;
    local_8c8 = fVar43;
    fStack_8c4 = fVar43;
    fStack_8c0 = fVar43;
    fStack_8bc = fVar43;
    local_8d8 = fVar60;
    fStack_8d4 = fVar60;
    fStack_8d0 = fVar60;
    fStack_8cc = fVar60;
    local_8e8 = fVar49;
    fStack_8e4 = fVar49;
    fStack_8e0 = fVar49;
    fStack_8dc = fVar49;
    local_8f8 = fVar39;
    fStack_8f4 = fVar39;
    fStack_8f0 = fVar39;
    fStack_8ec = fVar39;
    local_908 = fVar41;
    fStack_904 = fVar41;
    fStack_900 = fVar41;
    fStack_8fc = fVar41;
    local_918 = fVar44;
    fStack_914 = fVar44;
    fStack_910 = fVar44;
    fStack_90c = fVar44;
    local_928 = fVar46;
    fStack_924 = fVar46;
    fStack_920 = fVar46;
    fStack_91c = fVar46;
    fVar47 = fVar49;
    fVar50 = fVar49;
    fVar51 = fVar49;
    fVar53 = fVar36;
    fVar54 = fVar36;
    fVar55 = fVar36;
    fVar57 = fVar43;
    fVar58 = fVar43;
    fVar59 = fVar43;
    fVar61 = fVar60;
    fVar62 = fVar60;
    fVar63 = fVar60;
    fVar64 = fVar39;
    fVar65 = fVar39;
    fVar52 = fVar39;
    fVar56 = fVar41;
    fVar81 = fVar41;
    fVar69 = fVar41;
    fVar70 = fVar44;
    fVar71 = fVar44;
    fVar72 = fVar44;
    fVar73 = fVar46;
    fVar45 = fVar46;
    fVar48 = fVar46;
LAB_0067f3b5:
    if (local_998 != local_7d8) {
      uVar13 = local_998[-1];
      local_998 = local_998 + -1;
      while ((uVar13 & 8) == 0) {
        pfVar1 = (float *)(uVar13 + 0x20 + local_9a0);
        fVar14 = (*pfVar1 - fVar39) * fVar44;
        fVar17 = (pfVar1[1] - fVar64) * fVar70;
        fVar19 = (pfVar1[2] - fVar65) * fVar71;
        fVar21 = (pfVar1[3] - fVar52) * fVar72;
        pfVar1 = (float *)(uVar13 + 0x20 + uVar11);
        fVar23 = (*pfVar1 - fVar41) * fVar46;
        fVar26 = (pfVar1[1] - fVar56) * fVar73;
        fVar29 = (pfVar1[2] - fVar81) * fVar45;
        fVar32 = (pfVar1[3] - fVar69) * fVar48;
        uVar24 = (uint)((int)fVar23 < (int)fVar14) * (int)fVar14 |
                 (uint)((int)fVar23 >= (int)fVar14) * (int)fVar23;
        uVar27 = (uint)((int)fVar26 < (int)fVar17) * (int)fVar17 |
                 (uint)((int)fVar26 >= (int)fVar17) * (int)fVar26;
        uVar30 = (uint)((int)fVar29 < (int)fVar19) * (int)fVar19 |
                 (uint)((int)fVar29 >= (int)fVar19) * (int)fVar29;
        uVar33 = (uint)((int)fVar32 < (int)fVar21) * (int)fVar21 |
                 (uint)((int)fVar32 >= (int)fVar21) * (int)fVar32;
        pfVar1 = (float *)(uVar13 + 0x20 + uVar10);
        fVar14 = (*pfVar1 - fVar43) * fVar49;
        fVar17 = (pfVar1[1] - fVar57) * fVar47;
        fVar19 = (pfVar1[2] - fVar58) * fVar50;
        fVar21 = (pfVar1[3] - fVar59) * fVar51;
        uVar15 = (uint)((int)fVar14 < (int)fVar60) * (int)fVar60 |
                 (uint)((int)fVar14 >= (int)fVar60) * (int)fVar14;
        uVar18 = (uint)((int)fVar17 < (int)fVar61) * (int)fVar61 |
                 (uint)((int)fVar17 >= (int)fVar61) * (int)fVar17;
        uVar20 = (uint)((int)fVar19 < (int)fVar62) * (int)fVar62 |
                 (uint)((int)fVar19 >= (int)fVar62) * (int)fVar19;
        uVar22 = (uint)((int)fVar21 < (int)fVar63) * (int)fVar63 |
                 (uint)((int)fVar21 >= (int)fVar63) * (int)fVar21;
        pfVar1 = (float *)(uVar13 + 0x20 + uVar12);
        fVar14 = (*pfVar1 - fVar39) * fVar44;
        fVar17 = (pfVar1[1] - fVar64) * fVar70;
        fVar19 = (pfVar1[2] - fVar65) * fVar71;
        fVar21 = (pfVar1[3] - fVar52) * fVar72;
        pfVar1 = (float *)(uVar13 + 0x20 + (uVar11 ^ 0x10));
        fVar23 = (*pfVar1 - fVar41) * fVar46;
        fVar26 = (pfVar1[1] - fVar56) * fVar73;
        fVar29 = (pfVar1[2] - fVar81) * fVar45;
        fVar32 = (pfVar1[3] - fVar69) * fVar48;
        uVar35 = (uint)((int)fVar14 < (int)fVar23) * (int)fVar14 |
                 (uint)((int)fVar14 >= (int)fVar23) * (int)fVar23;
        uVar38 = (uint)((int)fVar17 < (int)fVar26) * (int)fVar17 |
                 (uint)((int)fVar17 >= (int)fVar26) * (int)fVar26;
        uVar40 = (uint)((int)fVar19 < (int)fVar29) * (int)fVar19 |
                 (uint)((int)fVar19 >= (int)fVar29) * (int)fVar29;
        uVar42 = (uint)((int)fVar21 < (int)fVar32) * (int)fVar21 |
                 (uint)((int)fVar21 >= (int)fVar32) * (int)fVar32;
        pfVar1 = (float *)(uVar13 + 0x20 + (uVar10 ^ 0x10));
        fVar14 = (*pfVar1 - fVar43) * fVar49;
        fVar17 = (pfVar1[1] - fVar57) * fVar47;
        fVar19 = (pfVar1[2] - fVar58) * fVar50;
        fVar21 = (pfVar1[3] - fVar59) * fVar51;
        uVar25 = (uint)((int)fVar36 < (int)fVar14) * (int)fVar36 |
                 (uint)((int)fVar36 >= (int)fVar14) * (int)fVar14;
        uVar28 = (uint)((int)fVar53 < (int)fVar17) * (int)fVar53 |
                 (uint)((int)fVar53 >= (int)fVar17) * (int)fVar17;
        uVar31 = (uint)((int)fVar54 < (int)fVar19) * (int)fVar54 |
                 (uint)((int)fVar54 >= (int)fVar19) * (int)fVar19;
        uVar34 = (uint)((int)fVar55 < (int)fVar21) * (int)fVar55 |
                 (uint)((int)fVar55 >= (int)fVar21) * (int)fVar21;
        auVar37._0_4_ =
             -(uint)((int)(((int)uVar35 < (int)uVar25) * uVar35 |
                          ((int)uVar35 >= (int)uVar25) * uVar25) <
                    (int)(((int)uVar15 < (int)uVar24) * uVar24 |
                         ((int)uVar15 >= (int)uVar24) * uVar15));
        auVar37._4_4_ =
             -(uint)((int)(((int)uVar38 < (int)uVar28) * uVar38 |
                          ((int)uVar38 >= (int)uVar28) * uVar28) <
                    (int)(((int)uVar18 < (int)uVar27) * uVar27 |
                         ((int)uVar18 >= (int)uVar27) * uVar18));
        auVar37._8_4_ =
             -(uint)((int)(((int)uVar40 < (int)uVar31) * uVar40 |
                          ((int)uVar40 >= (int)uVar31) * uVar31) <
                    (int)(((int)uVar20 < (int)uVar30) * uVar30 |
                         ((int)uVar20 >= (int)uVar30) * uVar20));
        auVar37._12_4_ =
             -(uint)((int)(((int)uVar42 < (int)uVar34) * uVar42 |
                          ((int)uVar42 >= (int)uVar34) * uVar34) <
                    (int)(((int)uVar22 < (int)uVar33) * uVar33 |
                         ((int)uVar22 >= (int)uVar33) * uVar22));
        uVar15 = movmskps((int)puVar7,auVar37);
        puVar7 = (undefined1 *)(ulong)uVar15;
        if (uVar15 == 0xf) goto LAB_0067f3b5;
        bVar6 = (byte)uVar15 ^ 0xf;
        puVar7 = (undefined1 *)(uVar13 & 0xfffffffffffffff0);
        lVar9 = 0;
        if (bVar6 != 0) {
          for (; (bVar6 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
          }
        }
        uVar13 = *(ulong *)(puVar7 + lVar9 * 8);
        uVar15 = bVar6 - 1 & (uint)bVar6;
        uVar8 = (ulong)uVar15;
        if (uVar15 != 0) {
          do {
            *local_998 = uVar13;
            local_998 = local_998 + 1;
            lVar9 = 0;
            if (uVar8 != 0) {
              for (; (uVar8 >> lVar9 & 1) == 0; lVar9 = lVar9 + 1) {
              }
            }
            uVar13 = *(ulong *)(puVar7 + lVar9 * 8);
            uVar8 = uVar8 - 1 & uVar8;
          } while (uVar8 != 0);
        }
      }
      local_9a8 = (ulong)((uint)uVar13 & 0xf) - 8;
      uVar13 = uVar13 & 0xfffffffffffffff0;
      for (local_9b0 = 0; local_9b0 != local_9a8; local_9b0 = local_9b0 + 1) {
        lVar9 = local_9b0 * 0xb0;
        pfVar1 = (float *)(uVar13 + 0x80 + lVar9);
        fVar36 = *pfVar1;
        fVar39 = pfVar1[1];
        fVar41 = pfVar1[2];
        fVar43 = pfVar1[3];
        pfVar1 = (float *)(uVar13 + 0x40 + lVar9);
        fVar49 = *pfVar1;
        fVar60 = pfVar1[1];
        fVar47 = pfVar1[2];
        fVar50 = pfVar1[3];
        pfVar1 = (float *)(uVar13 + 0x70 + lVar9);
        fVar51 = *pfVar1;
        fVar53 = pfVar1[1];
        fVar54 = pfVar1[2];
        fVar55 = pfVar1[3];
        pfVar1 = (float *)(uVar13 + 0x50 + lVar9);
        fVar57 = *pfVar1;
        fVar58 = pfVar1[1];
        fVar59 = pfVar1[2];
        fVar61 = pfVar1[3];
        local_9c8 = fVar51 * fVar57 - fVar36 * fVar49;
        fStack_9c4 = fVar53 * fVar58 - fVar39 * fVar60;
        fStack_9c0 = fVar54 * fVar59 - fVar41 * fVar47;
        fStack_9bc = fVar55 * fVar61 - fVar43 * fVar50;
        pfVar1 = (float *)(uVar13 + 0x60 + lVar9);
        fVar62 = *pfVar1;
        fVar63 = pfVar1[1];
        fVar64 = pfVar1[2];
        fVar65 = pfVar1[3];
        pfVar1 = (float *)(uVar13 + lVar9);
        pfVar2 = (float *)(uVar13 + 0x10 + lVar9);
        fVar52 = (ray->org).field_0.m128[0];
        fVar56 = (ray->org).field_0.m128[1];
        fVar81 = (ray->org).field_0.m128[2];
        fVar69 = (ray->dir).field_0.m128[0];
        fVar44 = (ray->dir).field_0.m128[1];
        fVar70 = (ray->dir).field_0.m128[2];
        fVar45 = *pfVar1 - fVar52;
        fVar48 = pfVar1[1] - fVar52;
        fVar14 = pfVar1[2] - fVar52;
        fVar52 = pfVar1[3] - fVar52;
        fVar17 = *pfVar2 - fVar56;
        fVar19 = pfVar2[1] - fVar56;
        fVar21 = pfVar2[2] - fVar56;
        fVar56 = pfVar2[3] - fVar56;
        fVar82 = fVar45 * fVar44 - fVar69 * fVar17;
        fVar83 = fVar48 * fVar44 - fVar69 * fVar19;
        fVar84 = fVar14 * fVar44 - fVar69 * fVar21;
        fVar85 = fVar52 * fVar44 - fVar69 * fVar56;
        pfVar1 = (float *)(uVar13 + 0x30 + lVar9);
        fVar71 = *pfVar1;
        fVar72 = pfVar1[1];
        fVar46 = pfVar1[2];
        fVar73 = pfVar1[3];
        local_7f8._0_4_ = fVar36 * fVar71 - fVar57 * fVar62;
        local_7f8._4_4_ = fVar39 * fVar72 - fVar58 * fVar63;
        local_7f8._8_4_ = fVar41 * fVar46 - fVar59 * fVar64;
        local_7f8._12_4_ = fVar43 * fVar73 - fVar61 * fVar65;
        pfVar1 = (float *)(uVar13 + 0x20 + lVar9);
        fVar78 = *pfVar1 - fVar81;
        fVar79 = pfVar1[1] - fVar81;
        fVar80 = pfVar1[2] - fVar81;
        fVar81 = pfVar1[3] - fVar81;
        fVar74 = fVar69 * fVar78 - fVar45 * fVar70;
        fVar75 = fVar69 * fVar79 - fVar48 * fVar70;
        fVar76 = fVar69 * fVar80 - fVar14 * fVar70;
        fVar77 = fVar69 * fVar81 - fVar52 * fVar70;
        local_7e8[0] = fVar49 * fVar62 - fVar51 * fVar71;
        local_7e8[1] = fVar60 * fVar63 - fVar53 * fVar72;
        local_7e8[2] = fVar47 * fVar64 - fVar54 * fVar46;
        local_7e8[3] = fVar50 * fVar65 - fVar55 * fVar73;
        fVar23 = fVar70 * fVar17 - fVar44 * fVar78;
        fVar26 = fVar70 * fVar19 - fVar44 * fVar79;
        fVar29 = fVar70 * fVar21 - fVar44 * fVar80;
        fVar32 = fVar70 * fVar56 - fVar44 * fVar81;
        fVar66 = fVar44 * local_7f8._0_4_ + fVar70 * local_7e8[0] + local_9c8 * fVar69;
        fVar67 = fVar44 * local_7f8._4_4_ + fVar70 * local_7e8[1] + fStack_9c4 * fVar69;
        fVar68 = fVar44 * local_7f8._8_4_ + fVar70 * local_7e8[2] + fStack_9c0 * fVar69;
        fVar69 = fVar44 * local_7f8._12_4_ + fVar70 * local_7e8[3] + fStack_9bc * fVar69;
        uVar18 = (uint)fVar66 & 0x80000000;
        uVar20 = (uint)fVar67 & 0x80000000;
        uVar22 = (uint)fVar68 & 0x80000000;
        uVar24 = (uint)fVar69 & 0x80000000;
        local_898._0_4_ =
             (float)((uint)(fVar62 * fVar23 + fVar51 * fVar74 + fVar36 * fVar82) ^ uVar18);
        local_898._4_4_ =
             (float)((uint)(fVar63 * fVar26 + fVar53 * fVar75 + fVar39 * fVar83) ^ uVar20);
        local_898._8_4_ =
             (float)((uint)(fVar64 * fVar29 + fVar54 * fVar76 + fVar41 * fVar84) ^ uVar22);
        local_898._12_4_ =
             (float)((uint)(fVar65 * fVar32 + fVar55 * fVar77 + fVar43 * fVar85) ^ uVar24);
        local_888 = (float)((uint)(fVar23 * fVar71 + fVar74 * fVar49 + fVar82 * fVar57) ^ uVar18);
        fStack_884 = (float)((uint)(fVar26 * fVar72 + fVar75 * fVar60 + fVar83 * fVar58) ^ uVar20);
        fStack_880 = (float)((uint)(fVar29 * fVar46 + fVar76 * fVar47 + fVar84 * fVar59) ^ uVar22);
        fStack_87c = (float)((uint)(fVar32 * fVar73 + fVar77 * fVar50 + fVar85 * fVar61) ^ uVar24);
        local_868 = ABS(fVar66);
        fStack_864 = ABS(fVar67);
        fStack_860 = ABS(fVar68);
        fStack_85c = ABS(fVar69);
        uVar25 = -(uint)(local_898._0_4_ + local_888 <= local_868) &
                 -(uint)((0.0 <= local_888 && 0.0 <= local_898._0_4_) && fVar66 != 0.0) &
                 local_8a8._0_4_;
        uVar27 = -(uint)(local_898._4_4_ + fStack_884 <= fStack_864) &
                 -(uint)((0.0 <= fStack_884 && 0.0 <= local_898._4_4_) && fVar67 != 0.0) &
                 local_8a8._4_4_;
        uVar28 = -(uint)(local_898._8_4_ + fStack_880 <= fStack_860) &
                 -(uint)((0.0 <= fStack_880 && 0.0 <= local_898._8_4_) && fVar68 != 0.0) &
                 local_8a8._8_4_;
        uVar30 = -(uint)(local_898._12_4_ + fStack_87c <= fStack_85c) &
                 -(uint)((0.0 <= fStack_87c && 0.0 <= local_898._12_4_) && fVar69 != 0.0) &
                 local_8a8._12_4_;
        auVar5._4_4_ = uVar27;
        auVar5._0_4_ = uVar25;
        auVar5._8_4_ = uVar28;
        auVar5._12_4_ = uVar30;
        uVar15 = movmskps((int)puVar7,auVar5);
        puVar7 = (undefined1 *)(ulong)uVar15;
        if (uVar15 != 0) {
          local_878 = (float)(uVar18 ^ (uint)(fVar45 * local_9c8 +
                                             fVar17 * local_7f8._0_4_ + fVar78 * local_7e8[0]));
          fStack_874 = (float)(uVar20 ^ (uint)(fVar48 * fStack_9c4 +
                                              fVar19 * local_7f8._4_4_ + fVar79 * local_7e8[1]));
          fStack_870 = (float)(uVar22 ^ (uint)(fVar14 * fStack_9c0 +
                                              fVar21 * local_7f8._8_4_ + fVar80 * local_7e8[2]));
          fStack_86c = (float)(uVar24 ^ (uint)(fVar52 * fStack_9bc +
                                              fVar56 * local_7f8._12_4_ + fVar81 * local_7e8[3]));
          fVar36 = (ray->org).field_0.m128[3];
          fVar39 = ray->tfar;
          local_848._0_4_ =
               -(uint)(fVar36 * local_868 < local_878 && local_878 <= fVar39 * local_868) & uVar25;
          local_848._4_4_ =
               -(uint)(fVar36 * fStack_864 < fStack_874 && fStack_874 <= fVar39 * fStack_864) &
               uVar27;
          local_848._8_4_ =
               -(uint)(fVar36 * fStack_860 < fStack_870 && fStack_870 <= fVar39 * fStack_860) &
               uVar28;
          local_848._12_4_ =
               -(uint)(fVar36 * fStack_85c < fStack_86c && fStack_86c <= fVar39 * fStack_85c) &
               uVar30;
          uVar15 = movmskps((int)context,local_848);
          context = (RayQueryContext *)(ulong)uVar15;
          if (uVar15 != 0) {
            local_808._4_4_ = fStack_9c4;
            local_808._0_4_ = local_9c8;
            local_808._8_4_ = fStack_9c0;
            local_808._12_4_ = fStack_9bc;
            local_9c8 = SUB84(local_9d0->scene,0);
            fStack_9c4 = (float)((ulong)local_9d0->scene >> 0x20);
            auVar4._4_4_ = fStack_864;
            auVar4._0_4_ = local_868;
            auVar4._8_4_ = fStack_860;
            auVar4._12_4_ = fStack_85c;
            auVar16 = rcpps(local_808,auVar4);
            fVar36 = auVar16._0_4_;
            fVar39 = auVar16._4_4_;
            fVar41 = auVar16._8_4_;
            fVar43 = auVar16._12_4_;
            fVar36 = (1.0 - local_868 * fVar36) * fVar36 + fVar36;
            fVar39 = (1.0 - fStack_864 * fVar39) * fVar39 + fVar39;
            fVar41 = (1.0 - fStack_860 * fVar41) * fVar41 + fVar41;
            fVar43 = (1.0 - fStack_85c * fVar43) * fVar43 + fVar43;
            local_818[0] = local_878 * fVar36;
            local_818[1] = fStack_874 * fVar39;
            local_818[2] = fStack_870 * fVar41;
            local_818[3] = fStack_86c * fVar43;
            local_838._0_4_ = local_898._0_4_ * fVar36;
            local_838._4_4_ = local_898._4_4_ * fVar39;
            local_838._8_4_ = local_898._8_4_ * fVar41;
            local_838._12_4_ = local_898._12_4_ * fVar43;
            local_828._0_4_ = fVar36 * local_888;
            local_828._4_4_ = fVar39 * fStack_884;
            local_828._8_4_ = fVar41 * fStack_880;
            local_828._12_4_ = fVar43 * fStack_87c;
            local_990 = (ulong)(byte)uVar15;
            local_9d8 = lVar9 + uVar13;
            do {
              puVar7 = (undefined1 *)0x0;
              if (local_990 != 0) {
                for (; (local_990 >> (long)puVar7 & 1) == 0; puVar7 = puVar7 + 1) {
                }
              }
              local_970 = *(uint *)(local_9d8 + 0x90 + (long)puVar7 * 4);
              local_9b8 = *(long *)(*(long *)(CONCAT44(fStack_9c4,local_9c8) + 0x1e8) +
                                   (ulong)local_970 * 8);
              if ((*(uint *)(local_9b8 + 0x34) & ray->mask) == 0) {
                local_990 = local_990 ^ 1L << ((ulong)puVar7 & 0x3f);
              }
              else {
                if ((local_9d0->args->filter == (RTCFilterFunctionN)0x0) &&
                   (*(long *)(local_9b8 + 0x48) == 0)) {
LAB_0067f983:
                  ray->tfar = -INFINITY;
                  return;
                }
                local_9e0 = local_9d0->args;
                local_958.context = local_9d0->user;
                local_988 = *(undefined4 *)(local_808 + (long)puVar7 * 4);
                local_984 = local_7e8[(long)(puVar7 + -4)];
                local_980 = local_7e8[(long)puVar7];
                local_97c = *(undefined4 *)(local_838 + (long)puVar7 * 4);
                local_978 = local_818[(long)(puVar7 + -4)];
                local_974 = *(undefined4 *)(local_9d8 + 0xa0 + (long)puVar7 * 4);
                local_96c = (local_958.context)->instID[0];
                local_968 = (local_958.context)->instPrimID[0];
                fVar36 = ray->tfar;
                ray->tfar = local_818[(long)puVar7];
                local_9e4 = -1;
                local_958.valid = &local_9e4;
                local_958.geometryUserPtr = *(void **)(local_9b8 + 0x18);
                local_958.hit = (RTCHitN *)&local_988;
                local_958.N = 1;
                local_958.ray = (RTCRayN *)ray;
                if (((*(code **)(local_9b8 + 0x48) == (code *)0x0) ||
                    ((**(code **)(local_9b8 + 0x48))(&local_958), *local_958.valid != 0)) &&
                   ((local_9e0->filter == (RTCFilterFunctionN)0x0 ||
                    ((((local_9e0->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT && ((*(byte *)(local_9b8 + 0x3e) & 0x40) == 0))
                     || ((*local_9e0->filter)(&local_958), *local_958.valid != 0))))))
                goto LAB_0067f983;
                ray->tfar = fVar36;
                local_990 = local_990 ^ 1L << ((ulong)puVar7 & 0x3f);
              }
            } while (local_990 != 0);
            context = (RayQueryContext *)0x0;
          }
        }
        fVar49 = local_8e8;
        fVar47 = fStack_8e4;
        fVar50 = fStack_8e0;
        fVar51 = fStack_8dc;
        fVar36 = local_8b8;
        fVar53 = fStack_8b4;
        fVar54 = fStack_8b0;
        fVar55 = fStack_8ac;
        fVar43 = local_8c8;
        fVar57 = fStack_8c4;
        fVar58 = fStack_8c0;
        fVar59 = fStack_8bc;
        fVar60 = local_8d8;
        fVar61 = fStack_8d4;
        fVar62 = fStack_8d0;
        fVar63 = fStack_8cc;
        fVar39 = local_8f8;
        fVar64 = fStack_8f4;
        fVar65 = fStack_8f0;
        fVar52 = fStack_8ec;
        fVar41 = local_908;
        fVar56 = fStack_904;
        fVar81 = fStack_900;
        fVar69 = fStack_8fc;
        fVar44 = local_918;
        fVar70 = fStack_914;
        fVar71 = fStack_910;
        fVar72 = fStack_90c;
        fVar46 = local_928;
        fVar73 = fStack_924;
        fVar45 = fStack_920;
        fVar48 = fStack_91c;
      }
      goto LAB_0067f3b5;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }